

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::JunitReporter::writeGroup(JunitReporter *this,TestGroupNode *groupNode,double suiteTime)

{
  XmlWriter *this_00;
  pointer pPVar1;
  int iVar2;
  pointer pPVar3;
  ScopedElement e;
  allocator local_99;
  string local_98;
  undefined1 local_78 [8];
  string local_70;
  ScopedElement local_50;
  string local_48;
  double local_28;
  
  local_28 = suiteTime;
  std::__cxx11::string::string((string *)&local_98,"testsuite",(allocator *)(local_78 + 8));
  this_00 = &this->xml;
  XmlWriter::scopedElement((XmlWriter *)&local_50,(string *)this_00);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string((string *)&local_98,"name",(allocator *)(local_78 + 8));
  XmlWriter::writeAttribute(this_00,&local_98,&(groupNode->value).groupInfo.name);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string((string *)&local_98,"errors",(allocator *)(local_78 + 8));
  XmlWriter::writeAttribute<unsigned_int>(this_00,&local_98,&this->unexpectedExceptions);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string((string *)&local_98,"failures",(allocator *)&local_48);
  local_70._M_dataplus._M_p =
       (pointer)((groupNode->value).totals.assertions.failed - (ulong)this->unexpectedExceptions);
  XmlWriter::writeAttribute<unsigned_long>(this_00,&local_98,(unsigned_long *)(local_78 + 8));
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string((string *)&local_98,"tests",(allocator *)&local_48);
  local_70._M_dataplus._M_p =
       (pointer)((groupNode->value).totals.assertions.failed +
                 (groupNode->value).totals.assertions.passed +
                (groupNode->value).totals.assertions.failedButOk);
  XmlWriter::writeAttribute<unsigned_long>(this_00,&local_98,(unsigned_long *)(local_78 + 8));
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string((string *)&local_98,"hostname",(allocator *)(local_78 + 8));
  XmlWriter::writeAttribute<char[4]>(this_00,&local_98,(char (*) [4])"tbd");
  std::__cxx11::string::~string((string *)&local_98);
  iVar2 = (*(((this->super_CumulativeReporterBase).m_config.m_p)->super_IShared).super_NonCopyable.
            _vptr_NonCopyable[0xc])();
  if (iVar2 == 2) {
    std::__cxx11::string::string((string *)&local_98,"time",(allocator *)(local_78 + 8));
    XmlWriter::writeAttribute<char[1]>(this_00,&local_98,(char (*) [1])0x157b20);
  }
  else {
    std::__cxx11::string::string((string *)&local_98,"time",(allocator *)(local_78 + 8));
    XmlWriter::writeAttribute<double>(this_00,&local_98,&local_28);
  }
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string((string *)&local_98,"timestamp",(allocator *)(local_78 + 8));
  XmlWriter::writeAttribute<char[4]>(this_00,&local_98,(char (*) [4])"tbd");
  std::__cxx11::string::~string((string *)&local_98);
  pPVar1 = (groupNode->children).
           super__Vector_base<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pPVar3 = (groupNode->children).
                super__Vector_base<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pPVar3 != pPVar1; pPVar3 = pPVar3 + 1) {
    writeTestCase(this,pPVar3->m_p);
  }
  std::__cxx11::string::string((string *)&local_98,"system-out",&local_99);
  XmlWriter::scopedElement((XmlWriter *)local_78,(string *)this_00);
  std::__cxx11::stringbuf::str();
  trim((string *)(local_78 + 8),&local_48);
  XmlWriter::writeText((XmlWriter *)local_78,(string *)(local_78 + 8),false);
  std::__cxx11::string::~string((string *)(local_78 + 8));
  std::__cxx11::string::~string((string *)&local_48);
  XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string((string *)&local_98,"system-err",&local_99);
  XmlWriter::scopedElement((XmlWriter *)local_78,(string *)this_00);
  std::__cxx11::stringbuf::str();
  trim((string *)(local_78 + 8),&local_48);
  XmlWriter::writeText((XmlWriter *)local_78,(string *)(local_78 + 8),false);
  std::__cxx11::string::~string((string *)(local_78 + 8));
  std::__cxx11::string::~string((string *)&local_48);
  XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_78);
  std::__cxx11::string::~string((string *)&local_98);
  XmlWriter::ScopedElement::~ScopedElement(&local_50);
  return;
}

Assistant:

void writeGroup( TestGroupNode const& groupNode, double suiteTime ) {
            XmlWriter::ScopedElement e = xml.scopedElement( "testsuite" );
            TestGroupStats const& stats = groupNode.value;
            xml.writeAttribute( "name", stats.groupInfo.name );
            xml.writeAttribute( "errors", unexpectedExceptions );
            xml.writeAttribute( "failures", stats.totals.assertions.failed-unexpectedExceptions );
            xml.writeAttribute( "tests", stats.totals.assertions.total() );
            xml.writeAttribute( "hostname", "tbd" ); // !TBD
            if( m_config->showDurations() == ShowDurations::Never )
                xml.writeAttribute( "time", "" );
            else
                xml.writeAttribute( "time", suiteTime );
            xml.writeAttribute( "timestamp", "tbd" ); // !TBD

            // Write test cases
            for( TestGroupNode::ChildNodes::const_iterator
                    it = groupNode.children.begin(), itEnd = groupNode.children.end();
                    it != itEnd;
                    ++it )
                writeTestCase( **it );

            xml.scopedElement( "system-out" ).writeText( trim( stdOutForSuite.str() ), false );
            xml.scopedElement( "system-err" ).writeText( trim( stdErrForSuite.str() ), false );
        }